

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertPthreadMutexUnlock(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  UnlockNode *node;
  NodeSequence NVar2;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
  if (pFVar1 == (Function *)0x0) {
    node = createNode<(NodeType)4,decltype(nullptr),llvm::CallInst_const*>
                     ((void *)0x0,callInstruction);
  }
  else {
    node = createNode<(NodeType)4,llvm::CallInst_const*>(callInstruction);
  }
  NVar2.first = &addNode<UnlockNode>(this,node)->super_Node;
  NVar2.second = NVar2.first;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadMutexUnlock(const CallInst *callInstruction) {
    UnlockNode *unlockNode;
    if (callInstruction->getCalledFunction()) {
        unlockNode = addNode(createNode<NodeType::UNLOCK>(callInstruction));
    } else {
        unlockNode =
                addNode(createNode<NodeType::UNLOCK>(nullptr, callInstruction));
    }

    return {unlockNode, unlockNode};
}